

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

uc_afl_ret __thiscall UCAFL::set_exits(UCAFL *this,uint64_t *exits,size_t exit_count)

{
  uc_engine *puVar1;
  reference pvVar2;
  double __x;
  double __x_00;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v;
  uc_err err;
  size_t exit_count_local;
  uint64_t *exits_local;
  UCAFL *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = uc_ctl(this->uc_,0x44000004,1);
  if (v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::assign<unsigned_long_const*,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_48,exits,
               exits + exit_count);
    puVar1 = this->uc_;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,0);
    v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = uc_ctl(puVar1,0x48000006,pvVar2,exit_count);
    if (v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      this_local._4_4_ = UC_AFL_RET_OK;
    }
    else {
      log(__x_00);
      this_local._4_4_ = UC_AFL_RET_ERROR;
    }
  }
  else {
    log(__x);
    this_local._4_4_ = UC_AFL_RET_ERROR;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  return this_local._4_4_;
}

Assistant:

uc_afl_ret set_exits(const uint64_t* exits, size_t exit_count) {
        uc_err err;
        std::vector<uint64_t> v;

        err = uc_ctl_exits_enable(this->uc_);
        if (err) {
            ERR("Fail to enable exits for Unicorn Engine.\n");
            return UC_AFL_RET_ERROR;
        }

        v.assign(exits, exits + exit_count);
        err = uc_ctl_set_exits(uc_, (uint64_t*)&v[0], exit_count);

        if (err) {
            ERR("Fail to set exits.\n");
            return UC_AFL_RET_ERROR;
        }

        return UC_AFL_RET_OK;
    }